

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Prog * __thiscall duckdb_re2::Compiler::Finish(Compiler *this,Regexp *re)

{
  bool bVar1;
  Prog *pPVar2;
  int64_t iVar3;
  long lVar4;
  bool prefix_foldcase;
  string prefix;
  bool local_31;
  string local_30;
  
  if (this->failed_ == false) {
    pPVar2 = this->prog_;
    if ((pPVar2->start_ == 0) && (pPVar2->start_unanchored_ == 0)) {
      this->ninst_ = 1;
    }
    std::
    __uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>::
    operator=((__uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               *)&pPVar2->inst_,
              (__uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               *)&this->inst_);
    pPVar2 = this->prog_;
    pPVar2->size_ = this->ninst_;
    Prog::Optimize(pPVar2);
    Prog::Flatten(this->prog_);
    Prog::ComputeByteMap(this->prog_);
    if (this->prog_->reversed_ == false) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
      bVar1 = Regexp::RequiredPrefixForAccel(re,&local_30,&local_31);
      if (bVar1) {
        Prog::ConfigurePrefixAccel(this->prog_,&local_30,local_31);
      }
      std::__cxx11::string::~string((string *)&local_30);
    }
    pPVar2 = this->prog_;
    if (this->max_mem_ < 1) {
      iVar3 = 0x100000;
    }
    else {
      lVar4 = (long)pPVar2->size_ * -2;
      if ((pPVar2->list_heads_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>.
          super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl == (unsigned_short *)0x0) {
        lVar4 = 0;
      }
      lVar4 = this->max_mem_ + (long)pPVar2->size_ * -8 + lVar4 + -0x1b0;
      iVar3 = 0;
      if (0 < lVar4) {
        iVar3 = lVar4;
      }
    }
    pPVar2->dfa_mem_ = iVar3;
    this->prog_ = (Prog *)0x0;
  }
  else {
    pPVar2 = (Prog *)0x0;
  }
  return pPVar2;
}

Assistant:

Prog* Compiler::Finish(Regexp* re) {
  if (failed_)
    return NULL;

  if (prog_->start() == 0 && prog_->start_unanchored() == 0) {
    // No possible matches; keep Fail instruction only.
    ninst_ = 1;
  }

  // Hand off the array to Prog.
  prog_->inst_ = std::move(inst_);
  prog_->size_ = ninst_;

  prog_->Optimize();
  prog_->Flatten();
  prog_->ComputeByteMap();

  if (!prog_->reversed()) {
    std::string prefix;
    bool prefix_foldcase;
    if (re->RequiredPrefixForAccel(&prefix, &prefix_foldcase))
      prog_->ConfigurePrefixAccel(prefix, prefix_foldcase);
  }

  // Record remaining memory for DFA.
  if (max_mem_ <= 0) {
    prog_->set_dfa_mem(1<<20);
  } else {
    int64_t m = max_mem_ - sizeof(Prog);
    m -= prog_->size_*sizeof(Prog::Inst);  // account for inst_
    if (prog_->CanBitState())
      m -= prog_->size_*sizeof(uint16_t);  // account for list_heads_
    if (m < 0)
      m = 0;
    prog_->set_dfa_mem(m);
  }

  Prog* p = prog_;
  prog_ = NULL;
  return p;
}